

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# futex.h
# Opt level: O1

int absl::lts_20250127::synchronization_internal::FutexImpl::WaitRelativeTimeout
              (atomic<int> *v,int32_t val,timespec *rel_timeout)

{
  long lVar1;
  int *piVar2;
  int iVar3;
  __time_t *p_Var4;
  FutexTimespec ts;
  __time_t local_18;
  __syscall_slong_t local_10;
  
  p_Var4 = &local_18;
  iVar3 = 0;
  if (rel_timeout == (timespec *)0x0) {
    p_Var4 = (__time_t *)0x0;
  }
  else {
    local_18 = rel_timeout->tv_sec;
    local_10 = rel_timeout->tv_nsec;
  }
  lVar1 = syscall(0xca,v,0x80,val,p_Var4);
  if (lVar1 != 0) {
    piVar2 = __errno_location();
    iVar3 = -*piVar2;
  }
  return iVar3;
}

Assistant:

static int WaitRelativeTimeout(std::atomic<int32_t>* v, int32_t val,
                                 const struct timespec* rel_timeout) {
    FutexTimespec ts;
    // Atomically check that the futex value is still 0, and if it
    // is, sleep until abs_timeout or until woken by FUTEX_WAKE.
    auto err =
        syscall(SYS_futex, reinterpret_cast<int32_t*>(v), FUTEX_PRIVATE_FLAG,
                val, ToFutexTimespec(rel_timeout, &ts));
    if (err != 0) {
      return -errno;
    }
    return 0;
  }